

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool __thiscall PhongShader::fragment(PhongShader *this,Model *model,vec3f bar,TGAColor *color)

{
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [16];
  undefined6 uVar10;
  undefined8 uVar11;
  unkbyte10 Var12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [14];
  short sVar15;
  undefined4 uVar16;
  int iVar17;
  int iVar18;
  undefined1 auVar19 [13];
  TGAColor TVar20;
  vec<3UL,_double> *pvVar21;
  long lVar22;
  long lVar23;
  size_t sVar24;
  double *pdVar25;
  bool bVar26;
  int iVar27;
  double dVar28;
  double dVar29;
  int iVar30;
  undefined1 uVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined1 uVar37;
  char cVar38;
  undefined1 uVar39;
  char cVar40;
  char cVar41;
  double dVar42;
  vec<3UL,_double> ret_1;
  vec2f uv;
  vec3f bn;
  vec<3UL,_double> ret_9;
  vec3f j;
  vec3f i;
  mat<3UL,_3UL> AI;
  vec<3UL,_double> ret;
  mat<3UL,_3UL> B;
  vec3f n;
  double local_228 [4];
  double local_208 [4];
  vec2f local_1e8;
  vec<3UL,_double> local_1d8;
  vec<3UL,_double> local_1b8;
  vec<3UL,_double> local_198;
  vec<3UL,_double> local_178;
  mat<3UL,_3UL> local_158;
  mat<3UL,_3UL> local_108;
  vec<3UL,_double> local_b8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  double local_88;
  double dStack_80;
  double local_78 [2];
  vec<3UL,_double> local_68;
  vec3f local_48;
  char cVar2;
  char cVar3;
  char cVar4;
  
  local_108.rows[0].x = 0.0;
  local_108.rows[0].y = 0.0;
  local_108.rows[0].z = 0.0;
  lVar23 = 0;
  do {
    dVar28 = dot<3ul,double>((vec<3UL,_double> *)((long)&(this->varying_nrm).rows[2].x + lVar23),
                             &bar);
    lVar22 = 0;
    if (lVar23 != -0x30) {
      lVar22 = (ulong)(lVar23 != -0x18) * 8 + 8;
    }
    *(double *)((long)&local_108.rows[0].x + lVar22) = dVar28;
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x48);
  pvVar21 = vec<3UL,_double>::normalize(local_108.rows);
  local_1d8.x = pvVar21->x;
  local_1d8.y = pvVar21->y;
  local_1d8.z = pvVar21->z;
  lVar23 = 0;
  local_1e8.x = 0.0;
  do {
    dVar28 = local_1e8.x;
    local_1e8.x = dot<3ul,double>((vec<3UL,_double> *)((long)&(this->varying_uv).rows[1].x + lVar23)
                                  ,&bar);
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x30);
  local_108.rows[2].y = 0.0;
  local_108.rows[2].z = 0.0;
  local_108.rows[1].z = 0.0;
  local_108.rows[2].x = 0.0;
  local_108.rows[1].x = 0.0;
  local_108.rows[1].y = 0.0;
  local_208[0] = 0.0;
  local_208[1] = 0.0;
  local_208[2] = 0.0;
  lVar23 = 0;
  do {
    lVar22 = 0;
    if (lVar23 != -0x30) {
      lVar22 = (ulong)(lVar23 != -0x18) * 8 + 8;
    }
    *(undefined8 *)((long)local_208 + lVar22) =
         *(undefined8 *)((long)&(this->ndc_tri).rows[2].y + lVar23);
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x48);
  local_158.rows[0].x = 0.0;
  local_158.rows[0].y = 0.0;
  local_158.rows[0].z = 0.0;
  lVar23 = 0;
  do {
    lVar22 = 0;
    if (lVar23 != -0x30) {
      lVar22 = (ulong)(lVar23 != -0x18) * 8 + 8;
    }
    *(undefined8 *)((long)&local_158.rows[0].x + lVar22) =
         *(undefined8 *)((long)&(this->ndc_tri).rows[2].x + lVar23);
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x48);
  lVar23 = 3;
  local_1e8.y = dVar28;
  do {
    dVar28 = vec<3UL,_double>::operator[](local_158.rows,lVar23 - 1);
    lVar22 = (ulong)(lVar23 != 2) * 8 + 8;
    if (lVar23 == 1) {
      lVar22 = 0;
    }
    *(double *)((long)local_208 + lVar22) = *(double *)((long)local_208 + lVar22) - dVar28;
    lVar23 = lVar23 + -1;
  } while (lVar23 != 0);
  local_108.rows[0].z = local_208[2];
  local_108.rows[0].x = local_208[0];
  local_108.rows[0].y = local_208[1];
  local_228[0] = 0.0;
  local_228[1] = 0.0;
  local_228[2] = 0.0;
  lVar23 = 0;
  do {
    lVar22 = 0;
    if (lVar23 != -0x30) {
      lVar22 = (ulong)(lVar23 != -0x18) * 8 + 8;
    }
    *(undefined8 *)((long)local_228 + lVar22) =
         *(undefined8 *)((long)&(this->ndc_tri).rows[2].z + lVar23);
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x48);
  local_158.rows[0].x = 0.0;
  local_158.rows[0].y = 0.0;
  local_158.rows[0].z = 0.0;
  lVar23 = 0;
  do {
    lVar22 = 0;
    if (lVar23 != -0x30) {
      lVar22 = (ulong)(lVar23 != -0x18) * 8 + 8;
    }
    *(undefined8 *)((long)&local_158.rows[0].x + lVar22) =
         *(undefined8 *)((long)&(this->ndc_tri).rows[2].x + lVar23);
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x48);
  lVar23 = 3;
  do {
    dVar28 = vec<3UL,_double>::operator[](local_158.rows,lVar23 - 1);
    lVar22 = (ulong)(lVar23 != 2) * 8 + 8;
    if (lVar23 == 1) {
      lVar22 = 0;
    }
    *(double *)((long)local_228 + lVar22) = *(double *)((long)local_228 + lVar22) - dVar28;
    lVar23 = lVar23 + -1;
  } while (lVar23 != 0);
  local_108.rows[1].z = local_228[2];
  local_108.rows[1].x = local_228[0];
  local_108.rows[1].y = local_228[1];
  local_108.rows[2].x = local_1d8.x;
  local_108.rows[2].y = local_1d8.y;
  local_108.rows[2].z = local_1d8.z;
  mat<3UL,_3UL>::invert(&local_158,&local_108);
  dVar29 = (this->varying_uv).rows[0].x;
  dVar28 = (this->varying_uv).rows[0].z - dVar29;
  local_b8.y._0_1_ = SUB81(dVar28,0);
  local_b8.x = (this->varying_uv).rows[0].y - dVar29;
  local_b8.y._1_1_ = (char)((ulong)dVar28 >> 8);
  local_b8.y._2_1_ = (char)((ulong)dVar28 >> 0x10);
  local_b8.y._3_1_ = (char)((ulong)dVar28 >> 0x18);
  local_b8.y._4_1_ = (char)((ulong)dVar28 >> 0x20);
  local_b8.y._5_1_ = (char)((ulong)dVar28 >> 0x28);
  local_b8.y._6_1_ = (char)((ulong)dVar28 >> 0x30);
  local_b8.y._7_1_ = (char)((ulong)dVar28 >> 0x38);
  local_b8.z = 0.0;
  local_178.x = 0.0;
  local_178.y = 0.0;
  local_178.z = 0.0;
  lVar23 = 0x30;
  do {
    dVar28 = dot<3ul,double>((vec<3UL,_double> *)((long)&local_158.rows[0].x + lVar23),&local_b8);
    lVar22 = (ulong)(lVar23 != 0x18) * 8 + 8;
    if (lVar23 == 0) {
      lVar22 = 0;
    }
    *(double *)((long)&local_178.x + lVar22) = dVar28;
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x18);
  dVar29 = (this->varying_uv).rows[1].x;
  dVar28 = (this->varying_uv).rows[1].y - dVar29;
  uVar31 = SUB81(dVar28,0);
  uVar32 = (undefined1)((ulong)dVar28 >> 8);
  uVar33 = (undefined1)((ulong)dVar28 >> 0x10);
  uVar34 = (undefined1)((ulong)dVar28 >> 0x18);
  uVar35 = (undefined1)((ulong)dVar28 >> 0x20);
  uVar36 = (undefined1)((ulong)dVar28 >> 0x28);
  uVar37 = (undefined1)((ulong)dVar28 >> 0x30);
  uVar39 = (undefined1)((ulong)dVar28 >> 0x38);
  dVar29 = (this->varying_uv).rows[1].z - dVar29;
  local_b8.y._0_1_ = SUB81(dVar29,0);
  local_b8.x = dVar28;
  local_b8.y._1_1_ = (char)((ulong)dVar29 >> 8);
  local_b8.y._2_1_ = (char)((ulong)dVar29 >> 0x10);
  local_b8.y._3_1_ = (char)((ulong)dVar29 >> 0x18);
  local_b8.y._4_1_ = (char)((ulong)dVar29 >> 0x20);
  local_b8.y._5_1_ = (char)((ulong)dVar29 >> 0x28);
  local_b8.y._6_1_ = (char)((ulong)dVar29 >> 0x30);
  local_b8.y._7_1_ = (char)((ulong)dVar29 >> 0x38);
  local_b8.z = 0.0;
  local_198.x = 0.0;
  local_198.y = 0.0;
  local_198.z = 0.0;
  lVar23 = 0x30;
  do {
    dVar28 = dot<3ul,double>((vec<3UL,_double> *)((long)&local_158.rows[0].x + lVar23),&local_b8);
    lVar22 = (ulong)(lVar23 != 0x18) * 8 + 8;
    if (lVar23 == 0) {
      lVar22 = 0;
    }
    *(double *)((long)&local_198.x + lVar22) = dVar28;
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x18);
  pdVar25 = &local_88;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_98 = 0;
  uStack_90 = 0;
  local_b8.z = 0.0;
  uStack_a0 = 0;
  local_b8._0_16_ = ZEXT816(0);
  local_78[0] = 0.0;
  pvVar21 = vec<3UL,_double>::normalize(&local_178);
  sVar24 = 2;
  do {
    dVar28 = vec<3UL,_double>::operator[](pvVar21,sVar24);
    *pdVar25 = dVar28;
    pdVar25 = pdVar25 + -3;
    bVar26 = sVar24 != 0;
    sVar24 = sVar24 - 1;
  } while (bVar26);
  pvVar21 = vec<3UL,_double>::normalize(&local_198);
  sVar24 = 2;
  pdVar25 = &dStack_80;
  do {
    dVar28 = vec<3UL,_double>::operator[](pvVar21,sVar24);
    *pdVar25 = dVar28;
    pdVar25 = pdVar25 + -3;
    bVar26 = sVar24 != 0;
    sVar24 = sVar24 - 1;
  } while (bVar26);
  sVar24 = 2;
  pdVar25 = local_78;
  do {
    dVar28 = vec<3UL,_double>::operator[](&local_1d8,sVar24);
    *pdVar25 = dVar28;
    pdVar25 = pdVar25 + -3;
    bVar26 = sVar24 != 0;
    sVar24 = sVar24 - 1;
  } while (bVar26);
  Model::normal(&local_48,model,&local_1e8);
  local_1b8.x = 0.0;
  local_1b8.y = 0.0;
  local_1b8.z = 0.0;
  lVar23 = 0x30;
  do {
    dVar28 = dot<3ul,double>((vec<3UL,_double> *)((long)&local_b8.x + lVar23),&local_48);
    lVar22 = (ulong)(lVar23 != 0x18) * 8 + 8;
    if (lVar23 == 0) {
      lVar22 = 0;
    }
    *(double *)((long)&local_1b8.x + lVar22) = dVar28;
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x18);
  pvVar21 = vec<3UL,_double>::normalize(&local_1b8);
  local_68.x = pvVar21->x;
  local_68.y = pvVar21->y;
  local_68.z = pvVar21->z;
  dVar29 = dot<3ul,double>(&local_68,&light_dir);
  TVar20 = Model::diffuse(model,&local_1e8);
  dVar28 = (double)(CONCAT17(uVar39,CONCAT16(uVar37,CONCAT15(uVar36,CONCAT14(uVar35,CONCAT13(uVar34,
                                                  CONCAT12(uVar33,CONCAT11(uVar32,uVar31))))))) ^
                   CONCAT17(uVar39,CONCAT16(uVar37,CONCAT15(uVar36,CONCAT14(uVar35,CONCAT13(uVar34,
                                                  CONCAT12(uVar33,CONCAT11(uVar32,uVar31))))))));
  if (dVar29 <= dVar28) {
    dVar29 = dVar28;
  }
  dVar42 = 1.0;
  if (dVar29 <= 1.0) {
    dVar42 = dVar29;
  }
  if (dVar42 <= dVar28) {
    dVar42 = dVar28;
  }
  auVar19[0xc] = TVar20.bgra[3];
  auVar19._0_12_ = ZEXT712(0);
  iVar17 = (int)((double)TVar20.bgra[0] * dVar42);
  iVar18 = (int)((double)TVar20.bgra[1] * dVar42);
  cVar38 = (char)((uint)iVar18 >> 0x10);
  iVar27 = (int)((double)(int)CONCAT32(auVar19._10_3_,(ushort)TVar20.bgra[2]) * dVar42);
  iVar30 = (int)((double)TVar20.bgra[3] * dVar42);
  cVar40 = (char)((uint)iVar27 >> 0x10);
  cVar41 = (char)((uint)iVar30 >> 0x10);
  uVar10 = CONCAT15((char)((uint)iVar18 >> 8),CONCAT14((char)iVar18,iVar17));
  uVar11 = CONCAT17((char)((uint)iVar18 >> 0x18),CONCAT16(cVar38,uVar10));
  Var12 = CONCAT19((char)((uint)iVar27 >> 8),CONCAT18((char)iVar27,uVar11));
  auVar13[10] = cVar40;
  auVar13._0_10_ = Var12;
  auVar13[0xb] = (char)((uint)iVar27 >> 0x18);
  auVar14[0xc] = (char)iVar30;
  auVar14._0_12_ = auVar13;
  auVar14[0xd] = (char)((uint)iVar30 >> 8);
  auVar9[0xe] = cVar41;
  auVar9._0_14_ = auVar14;
  auVar9[0xf] = (char)((uint)iVar30 >> 0x18);
  sVar5 = (short)iVar17;
  cVar1 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar17 - (0xff < sVar5);
  sVar5 = (short)((uint)iVar17 >> 0x10);
  sVar6 = (short)((uint6)uVar10 >> 0x20);
  cVar2 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar18 - (0xff < sVar6);
  sVar6 = (short)((ulong)uVar11 >> 0x30);
  sVar7 = (short)((unkuint10)Var12 >> 0x40);
  cVar3 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar27 - (0xff < sVar7);
  sVar7 = auVar13._10_2_;
  sVar8 = auVar14._12_2_;
  cVar4 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar30 - (0xff < sVar8);
  sVar8 = auVar9._14_2_;
  sVar15 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * (char)((uint)iVar17 >> 0x10) - (0xff < sVar5),
                    cVar1);
  uVar16 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * cVar38 - (0xff < sVar6),CONCAT12(cVar2,sVar15));
  uVar10 = CONCAT15((0 < sVar7) * (sVar7 < 0x100) * cVar40 - (0xff < sVar7),CONCAT14(cVar3,uVar16));
  sVar5 = (short)((uint)uVar16 >> 0x10);
  sVar6 = (short)((uint6)uVar10 >> 0x20);
  sVar7 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * cVar41 - (0xff < sVar8),
                           CONCAT16(cVar4,uVar10)) >> 0x30);
  *(uint *)color->bgra =
       CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                CONCAT12((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                         CONCAT11((0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5),
                                  (0 < sVar15) * (sVar15 < 0x100) * cVar1 - (0xff < sVar15))));
  color->bytespp = TVar20.bytespp;
  return false;
}

Assistant:

virtual bool fragment(Model& model, vec3f bar, TGAColor& color)
    {
        vec3f bn = (varying_nrm * bar).normalize();
        vec2f uv = varying_uv * bar;

        mat<3, 3> A;
        A[0] = ndc_tri.col(1) - ndc_tri.col(0);
        A[1] = ndc_tri.col(2) - ndc_tri.col(0);
        A[2] = bn;

        mat<3, 3> AI = A.invert();

        vec3f i =
            AI * vec3f(varying_uv[0][1] - varying_uv[0][0], varying_uv[0][2] - varying_uv[0][0], 0);
        vec3f j =
            AI * vec3f(varying_uv[1][1] - varying_uv[1][0], varying_uv[1][2] - varying_uv[1][0], 0);

        mat<3, 3> B;
        B.set_col(0, i.normalize());
        B.set_col(1, j.normalize());
        B.set_col(2, bn);

        vec3f n = (B * model.normal(uv)).normalize();

        double diff = std::max(0., dot(n, light_dir));
        color = model.diffuse(uv) * diff;

        return false;
    }